

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O3

EC_GROUP * d2i_ECPKParameters(EC_GROUP **param_1,uchar **in,long len)

{
  EC_GROUP *pEVar1;
  CBS cbs;
  CBS local_28;
  
  if (len < 0) {
    pEVar1 = (EC_GROUP *)0x0;
  }
  else {
    local_28.data = *in;
    local_28.len = len;
    pEVar1 = EC_KEY_parse_parameters(&local_28);
    if (pEVar1 != (EC_GROUP *)0x0) {
      if (param_1 != (EC_GROUP **)0x0) {
        EC_GROUP_free(*param_1);
        *param_1 = (EC_GROUP *)pEVar1;
      }
      *in = local_28.data;
    }
  }
  return (EC_GROUP *)pEVar1;
}

Assistant:

EC_GROUP *d2i_ECPKParameters(EC_GROUP **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EC_GROUP *ret = EC_KEY_parse_parameters(&cbs);
  if (ret == NULL) {
    return NULL;
  }

  if (out != NULL) {
    EC_GROUP_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}